

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6d004::SymlinkCommand::start
          (SymlinkCommand *this,BuildSystem *param_1,TaskInterface ti)

{
  pointer ppBVar1;
  StringRef str;
  pointer ppBVar2;
  BuildKey local_80;
  TaskInterface local_60;
  long *local_50 [2];
  long local_40 [2];
  
  local_60.ctx = ti.ctx;
  local_60.impl = ti.impl;
  ppBVar2 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar2 != ppBVar1) {
    do {
      str.Data = ((*ppBVar2)->super_Node).name._M_dataplus._M_p;
      str.Length = ((*ppBVar2)->super_Node).name._M_string_length;
      llbuild::buildsystem::BuildKey::BuildKey(&local_80,'N',str);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_80.key.key._M_dataplus._M_p,
                 local_80.key.key._M_dataplus._M_p + local_80.key.key._M_string_length);
      llbuild::core::TaskInterface::mustFollow(&local_60,(KeyType *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.key.key._M_dataplus._M_p != &local_80.key.key.field_2) {
        operator_delete(local_80.key.key._M_dataplus._M_p,
                        local_80.key.key.field_2._M_allocated_capacity + 1);
      }
      ppBVar2 = ppBVar2 + 1;
    } while (ppBVar2 != ppBVar1);
  }
  return;
}

Assistant:

virtual void start(BuildSystem&, TaskInterface ti) override {
    // The command itself takes no inputs, so just treat any declared inputs as
    // "must follow" directives.
    //
    // FIXME: We should make this explicit once we have actual support for must
    // follow inputs.
    for (auto it = inputs.begin(), ie = inputs.end(); it != ie; ++it) {
      ti.mustFollow(BuildKey::makeNode(*it).toData());
    }
  }